

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signet.cpp
# Opt level: O1

optional<SignetTxs> *
SignetTxs::Create(optional<SignetTxs> *__return_storage_ptr__,CBlock *block,CScript *challenge)

{
  uchar *puVar1;
  element_type *peVar2;
  pointer pCVar3;
  char *pcVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  vector<uint256,_std::allocator<uint256>_> hashes;
  pointer pCVar8;
  bool bVar9;
  undefined8 uVar10;
  int iVar11;
  uint uVar12;
  pointer pbVar14;
  pointer psVar15;
  size_type *psVar16;
  long lVar17;
  CScript *pCVar18;
  ulong uVar19;
  CScript *this;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  VectorWriter writer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signet_solution;
  CMutableTransaction tx_to_spend;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_data;
  CScript replacement;
  uint256 signet_merkle;
  CMutableTransaction modified_cb;
  CMutableTransaction tx_spending;
  undefined4 in_stack_fffffffffffffda8;
  uint uVar20;
  uint uVar21;
  _Storage<SignetTxs,_false> *p_Var22;
  opcodetype in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  char *local_238;
  long lStack_230;
  long local_228;
  undefined1 local_220 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> local_208;
  undefined8 local_1f0;
  vector<uint256,_std::allocator<uint256>_> local_1e8;
  undefined1 local_1c8 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> avStack_1b0 [4];
  vector<CTxIn,_std::allocator<CTxIn>_> local_148;
  vector<CTxOut,_std::allocator<CTxOut>_> local_130 [4];
  undefined1 local_c8 [8];
  pointer pbStack_c0;
  pointer local_b8;
  undefined1 local_a8 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> vStack_90;
  undefined1 local_70 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> local_58;
  undefined8 local_40;
  long local_38;
  ulong uVar13;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_220);
  local_1f0._0_4_ = 0;
  local_1f0._4_4_ = 0;
  local_1c8[0x10] = '\0';
  local_1c8[0x11] = '\0';
  local_1c8[0x12] = '\0';
  local_1c8[0x13] = '\0';
  local_1c8[0x14] = '\0';
  local_1c8[0x15] = '\0';
  local_1c8[0x16] = '\0';
  local_1c8[0x17] = '\0';
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_1c8._0_8_ = (char *)0x0;
  local_1c8[8] = '\0';
  local_1c8[9] = '\0';
  local_1c8[10] = '\0';
  local_1c8[0xb] = '\0';
  local_1c8[0xc] = '\0';
  local_1c8[0xd] = '\0';
  local_1c8[0xe] = '\0';
  local_1c8[0xf] = '\0';
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish._0_4_ = 0xffffffff;
  CScript::CScript((CScript *)local_70,OP_0);
  local_a8._0_8_ = (ulong)(uint)local_a8._4_4_ << 0x20;
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint,CScript,int>
            ((vector<CTxIn,std::allocator<CTxIn>> *)local_220,(COutPoint *)local_1c8,
             (CScript *)local_70,(int *)local_a8);
  if (0x1c < local_58.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_70._0_8_);
    local_70._0_8_ = (long *)0x0;
  }
  local_1c8._0_8_ = local_1c8._0_8_ & 0xffffffff00000000;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript_const&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&local_208,(int *)local_1c8,challenge);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_70);
  local_40._0_4_ = 0;
  local_40._4_4_ = 0;
  local_1c8._16_8_ = 0;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_1c8._0_8_ = (char *)0x0;
  local_1c8._8_8_ = 0;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish._0_4_ = 0xffffffff;
  local_a8._16_8_ = 0;
  vStack_90.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8._0_8_ = (char *)0x0;
  local_a8._8_8_ = 0;
  local_c8 = (undefined1  [8])((ulong)(uint)local_c8._4_4_ << 0x20);
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint,CScript,int>
            ((vector<CTxIn,std::allocator<CTxIn>> *)local_70,(COutPoint *)local_1c8,
             (CScript *)local_a8,(int *)local_c8);
  if (0x1c < vStack_90.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_a8._0_8_);
    local_a8._0_8_ = (char *)0x0;
  }
  local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
  CScript::CScript((CScript *)local_1c8,OP_RETURN);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&local_58,(int *)local_a8,(CScript *)local_1c8
            );
  if (0x1c < avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_1c8._0_8_);
    local_1c8._0_8_ = (char *)0x0;
  }
  psVar15 = (block->vtx).
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (psVar15 ==
      (block->vtx).
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->super__Optional_base<SignetTxs,_false,_false>)._M_payload.
    super__Optional_payload<SignetTxs,_true,_false,_false>.super__Optional_payload_base<SignetTxs>.
    _M_engaged = false;
  }
  else {
    CMutableTransaction::CMutableTransaction
              ((CMutableTransaction *)local_a8,
               (psVar15->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    pCVar8 = vStack_90.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    psVar15 = (block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = 0xffffffff;
    iVar11 = -1;
    if (psVar15 !=
        (block->vtx).
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      peVar2 = (psVar15->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pCVar3 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar17 = (long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar3;
      if (lVar17 != 0) {
        lVar17 = (lVar17 >> 3) * -0x3333333333333333;
        psVar16 = (size_type *)((long)&pCVar3->scriptPubKey + 0x1c);
        uVar19 = 0;
        do {
          if (((((0x42 < *psVar16) &&
                (pcVar4 = *(char **)&((CScriptBase *)(psVar16 + -7))->_union, *pcVar4 == 'j')) &&
               (pcVar4[1] == '$')) && ((pcVar4[2] == -0x56 && (pcVar4[3] == '!')))) &&
             ((pcVar4[4] == -0x57 && (pcVar4[5] == -0x13)))) {
            uVar13 = uVar19 & 0xffffffff;
          }
          iVar11 = (int)uVar13;
          uVar19 = uVar19 + 1;
          psVar16 = psVar16 + 10;
        } while (lVar17 + (ulong)(lVar17 == 0) != uVar19);
      }
    }
    if (iVar11 == -1) {
      (__return_storage_ptr__->super__Optional_base<SignetTxs,_false,_false>)._M_payload.
      super__Optional_payload<SignetTxs,_true,_false,_false>.super__Optional_payload_base<SignetTxs>
      ._M_engaged = false;
    }
    else {
      uVar19 = (ulong)iVar11;
      uVar13 = ((long)vStack_90.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)vStack_90.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      if (uVar13 < uVar19 || uVar13 - uVar19 == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          uVar10 = std::__throw_out_of_range_fmt
                             (
                             "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             );
          if (local_c8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_c8,(long)local_b8 - (long)local_c8);
          }
          if (0x1c < avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_) {
            free((void *)local_1c8._0_8_);
            local_1c8._0_8_ = (char *)0x0;
          }
          if (local_238 != (char *)0x0) {
            operator_delete(local_238,local_228 - (long)local_238);
          }
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_90);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_a8);
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_58);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_70);
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_208);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_220);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            _Unwind_Resume(uVar10);
          }
        }
        goto LAB_003c905e;
      }
      this = &vStack_90.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[uVar19].scriptPubKey;
      local_238 = (char *)0x0;
      local_228 = 0;
      local_1c8._16_8_ = 0;
      avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1c8._0_8_ = (char *)0x0;
      local_1c8._8_8_ = 0;
      lStack_230 = 0;
      local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)this;
      if (0x1c < vStack_90.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar19].scriptPubKey.super_CScriptBase._size) {
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(this->super_CScriptBase)._union.indirect_contents.indirect;
      }
      local_c8 = (undefined1  [8])0x0;
      pbStack_c0 = (pointer)0x0;
      local_b8 = (pointer)0x0;
      uVar20 = 0;
      while( true ) {
        uVar21 = pCVar8[uVar19].scriptPubKey.super_CScriptBase._size;
        uVar12 = uVar21 - 0x1d;
        if (uVar21 < 0x1d) {
          uVar12 = uVar21;
        }
        pCVar18 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
        if (uVar21 < 0x1d) {
          pCVar18 = this;
        }
        bVar9 = GetScriptOp((const_iterator *)&local_1e8,
                            (uchar *)((long)&(pCVar18->super_CScriptBase)._union + (long)(int)uVar12
                                     ),(opcodetype *)&stack0xfffffffffffffdb8,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
        if (!bVar9) break;
        if ((undefined1  [8])pbStack_c0 == local_c8) {
          CScript::operator<<((CScript *)local_1c8,in_stack_fffffffffffffdb8);
        }
        else {
          if ((4 < (ulong)((long)pbStack_c0 - (long)local_c8) && (uVar20 & 1) == 0) &&
             (*(undefined4 *)local_c8 == 0xa2dac7ec)) {
            pbVar14 = pbStack_c0;
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_238,lStack_230,
                       (pointer)((long)local_c8 + 4));
            uVar20 = (uint)CONCAT71((int7)((ulong)pbVar14 >> 8),1);
            if ((pointer)((long)local_c8 + 4) != pbStack_c0) {
              pbStack_c0 = (pointer)((long)local_c8 + 4);
            }
          }
          b._M_extent._M_extent_value = (long)pbStack_c0 - (long)local_c8;
          b._M_ptr = (pointer)local_c8;
          CScript::operator<<((CScript *)local_1c8,b);
        }
      }
      uVar21 = uVar20;
      if ((uVar20 & 1) != 0) {
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&this->super_CScriptBase,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8);
      }
      p_Var22 = (_Storage<SignetTxs,_false> *)__return_storage_ptr__;
      if (local_c8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_c8,(long)local_b8 - (long)local_c8);
      }
      if (0x1c < avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_) {
        free((void *)local_1c8._0_8_);
        local_1c8._0_8_ = (char *)0x0;
      }
      if ((uVar20 & 1) == 0) {
LAB_003c8acb:
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<uint256,_std::allocator<uint256>_>::resize
                  (&local_1e8,
                   (long)(block->vtx).
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(block->vtx).
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4);
        CMutableTransaction::GetHash((Txid *)local_1c8,(CMutableTransaction *)local_a8);
        *(undefined8 *)
         (((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems + 0x10) =
             local_1c8._16_8_;
        *(pointer *)
         (((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems + 0x18) =
             avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(undefined8 *)
         ((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems =
             local_1c8._0_8_;
        *(undefined8 *)
         (((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems + 8) =
             local_1c8._8_8_;
        psVar15 = (block->vtx).
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (0x10 < (ulong)((long)(block->vtx).
                                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar15)) {
          uVar13 = 1;
          lVar17 = 0x10;
          do {
            lVar5 = *(long *)((long)&(psVar15->
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar17);
            uVar10 = *(undefined8 *)(lVar5 + 0x39);
            uVar6 = *(undefined8 *)(lVar5 + 0x41);
            uVar7 = *(undefined8 *)(lVar5 + 0x51);
            puVar1 = ((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
                     lVar17 * 2 + 0x10;
            *(undefined8 *)puVar1 = *(undefined8 *)(lVar5 + 0x49);
            *(undefined8 *)(puVar1 + 8) = uVar7;
            puVar1 = ((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
                     lVar17 * 2;
            *(undefined8 *)puVar1 = uVar10;
            *(undefined8 *)(puVar1 + 8) = uVar6;
            uVar13 = uVar13 + 1;
            psVar15 = (block->vtx).
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar17 = lVar17 + 0x10;
          } while (uVar13 < (ulong)((long)(block->vtx).
                                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar15
                                   >> 4));
        }
        local_1c8._0_8_ =
             local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_1c8._8_8_ =
             local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1c8._16_8_ =
             local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
        ._M_start._4_4_ = uVar21;
        hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
        ._M_start._0_4_ = in_stack_fffffffffffffda8;
        hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)p_Var22;
        hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage._0_4_ = in_stack_fffffffffffffdb8;
        hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage._4_4_ = in_stack_fffffffffffffdbc;
        ComputeMerkleRoot((uint256 *)local_c8,hashes,(bool *)local_1c8);
        if ((char *)local_1c8._0_8_ != (char *)0x0) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ - local_1c8._0_8_);
        }
        if (local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1c8._0_4_ = (block->super_CBlockHeader).nVersion;
        VectorWriter::write((VectorWriter *)&stack0xfffffffffffffdb8,(int)local_1c8,(void *)0x4,
                            (size_t)psVar15);
        VectorWriter::write((VectorWriter *)&stack0xfffffffffffffdb8,(int)block + 4,(void *)0x20,
                            (size_t)psVar15);
        VectorWriter::write((VectorWriter *)&stack0xfffffffffffffdb8,(int)local_c8,(void *)0x20,
                            (size_t)psVar15);
        local_1c8._0_4_ = (block->super_CBlockHeader).nTime;
        VectorWriter::write((VectorWriter *)&stack0xfffffffffffffdb8,(int)local_1c8,(void *)0x4,
                            (size_t)psVar15);
        b_00._M_extent._M_extent_value =
             (long)local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start;
        b_00._M_ptr = (pointer)local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>.
                               _M_impl.super__Vector_impl_data._M_start;
        CScript::operator<<((CScript *)(local_220._0_8_ + 0x28),b_00);
        CMutableTransaction::GetHash((Txid *)local_1c8,(CMutableTransaction *)local_220);
        *(undefined8 *)(local_70._0_8_ + 0x10) = local_1c8._16_8_;
        *(pointer *)(local_70._0_8_ + 0x18) =
             avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(undefined8 *)local_70._0_8_ = local_1c8._0_8_;
        *(undefined8 *)(local_70._0_8_ + 8) = local_1c8._8_8_;
        *(undefined4 *)(local_70._0_8_ + 0x20) = 0;
        SignetTxs<CMutableTransaction,CMutableTransaction>
                  ((SignetTxs *)local_1c8,(CMutableTransaction *)local_220,
                   (CMutableTransaction *)local_70);
        std::_Optional_payload_base<SignetTxs>::_Storage<SignetTxs,_false>::_Storage<SignetTxs>
                  ((_Storage<SignetTxs,_false> *)__return_storage_ptr__,local_1c8);
        *(_Storage<SignetTxs,_false> *)((long)__return_storage_ptr__ + 0x100) =
             (_Storage<SignetTxs,_false>)0x1;
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(local_130);
        std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_148);
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_1b0);
        std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_1c8);
        if ((CScript *)
            local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start != (CScript *)0x0) {
          operator_delete(local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        local_1c8._8_8_ = lStack_230 - (long)local_238;
        local_1c8._0_8_ = local_238;
        Unserialize<SpanReader,28u,unsigned_char>
                  ((SpanReader *)local_1c8,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(local_70._0_8_ + 0x28));
        VectorFormatter<DefaultFormatter>::
        Unser<SpanReader,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                  ((VectorFormatter<DefaultFormatter> *)local_c8,(SpanReader *)local_1c8,
                   (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)(local_70._0_8_ + 0x50));
        if (local_1c8._8_8_ == 0) goto LAB_003c8acb;
        *(_Storage<SignetTxs,_false> *)((long)__return_storage_ptr__ + 0x100) =
             (_Storage<SignetTxs,_false>)0x0;
      }
      if (local_238 != (char *)0x0) {
        operator_delete(local_238,local_228 - (long)local_238);
      }
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_90);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_a8);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_58);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_70);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_208);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_220);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (optional<SignetTxs> *)(_Storage<SignetTxs,_false> *)__return_storage_ptr__;
  }
LAB_003c905e:
  __stack_chk_fail();
}

Assistant:

std::optional<SignetTxs> SignetTxs::Create(const CBlock& block, const CScript& challenge)
{
    CMutableTransaction tx_to_spend;
    tx_to_spend.version = 0;
    tx_to_spend.nLockTime = 0;
    tx_to_spend.vin.emplace_back(COutPoint(), CScript(OP_0), 0);
    tx_to_spend.vout.emplace_back(0, challenge);

    CMutableTransaction tx_spending;
    tx_spending.version = 0;
    tx_spending.nLockTime = 0;
    tx_spending.vin.emplace_back(COutPoint(), CScript(), 0);
    tx_spending.vout.emplace_back(0, CScript(OP_RETURN));

    // can't fill any other fields before extracting signet
    // responses from block coinbase tx

    // find and delete signet signature
    if (block.vtx.empty()) return std::nullopt; // no coinbase tx in block; invalid
    CMutableTransaction modified_cb(*block.vtx.at(0));

    const int cidx = GetWitnessCommitmentIndex(block);
    if (cidx == NO_WITNESS_COMMITMENT) {
        return std::nullopt; // require a witness commitment
    }

    CScript& witness_commitment = modified_cb.vout.at(cidx).scriptPubKey;

    std::vector<uint8_t> signet_solution;
    if (!FetchAndClearCommitmentSection(SIGNET_HEADER, witness_commitment, signet_solution)) {
        // no signet solution -- allow this to support OP_TRUE as trivial block challenge
    } else {
        try {
            SpanReader v{signet_solution};
            v >> tx_spending.vin[0].scriptSig;
            v >> tx_spending.vin[0].scriptWitness.stack;
            if (!v.empty()) return std::nullopt; // extraneous data encountered
        } catch (const std::exception&) {
            return std::nullopt; // parsing error
        }
    }
    uint256 signet_merkle = ComputeModifiedMerkleRoot(modified_cb, block);

    std::vector<uint8_t> block_data;
    VectorWriter writer{block_data, 0};
    writer << block.nVersion;
    writer << block.hashPrevBlock;
    writer << signet_merkle;
    writer << block.nTime;
    tx_to_spend.vin[0].scriptSig << block_data;
    tx_spending.vin[0].prevout = COutPoint(tx_to_spend.GetHash(), 0);

    return SignetTxs{tx_to_spend, tx_spending};
}